

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_perform_capa(connectdata *conn)

{
  CURLcode CVar1;
  
  (conn->proto).ftpc.cwdcount = 0;
  (conn->proto).imapc.cmdid = 0;
  (conn->proto).pop3c.tls_supported = false;
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","CAPA");
  if (CVar1 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_CAPABILITY;
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_perform_capa(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  pop3c->sasl.authmechs = SASL_AUTH_NONE; /* No known auth. mechanisms yet */
  pop3c->sasl.authused = SASL_AUTH_NONE;  /* Clear the auth. mechanism used */
  pop3c->tls_supported = FALSE;           /* Clear the TLS capability */

  /* Send the CAPA command */
  result = Curl_pp_sendf(&pop3c->pp, "%s", "CAPA");

  if(!result)
    state(conn, POP3_CAPA);

  return result;
}